

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint32_t helper_get_r13_banked_arm(CPUARMState *env,uint32_t mode)

{
  uint uVar1;
  uint32_t target_el;
  uint32_t *puVar2;
  
  uVar1 = env->uncached_cpsr & 0x1f;
  if (uVar1 == 0x1f) {
    target_el = exception_target_el(env);
    raise_exception_arm(env,1,0x2000000,target_el);
  }
  if (uVar1 == mode) {
    puVar2 = env->regs + 0xd;
  }
  else {
    uVar1 = mode - 0x10;
    if ((0xf < uVar1) || ((0x8ccfU >> (uVar1 & 0x1f) & 1) == 0)) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
                 ,0x99,(char *)0x0);
    }
    puVar2 = env->banked_r13 + *(long *)(&DAT_00d6a5f8 + (ulong)uVar1 * 8);
  }
  return *puVar2;
}

Assistant:

uint32_t HELPER(get_r13_banked)(CPUARMState *env, uint32_t mode)
{
    if ((env->uncached_cpsr & CPSR_M) == ARM_CPU_MODE_SYS) {
        /* SRS instruction is UNPREDICTABLE from System mode; we UNDEF.
         * Other UNPREDICTABLE and UNDEF cases were caught at translate time.
         */
        raise_exception(env, EXCP_UDEF, syn_uncategorized(),
                        exception_target_el(env));
    }

    if ((env->uncached_cpsr & CPSR_M) == mode) {
        return env->regs[13];
    } else {
        return env->banked_r13[bank_number(mode)];
    }
}